

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O3

bool __thiscall
xmrig::DaemonClient::parseResponse(DaemonClient *this,int64_t id,Value *result,Value *error)

{
  ushort uVar1;
  char *pcVar2;
  bool bVar3;
  Type pGVar4;
  Type error_00;
  int local_34;
  long local_30;
  
  if (id != -1) {
    if ((error->data_).f.flags == 3) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)error,"message");
      error_00 = (Type)((ulong)(pGVar4->data_).s.str & 0xffffffffffff);
      if (((pGVar4->data_).f.flags >> 0xc & 1) != 0) {
        error_00 = pGVar4;
      }
      bVar3 = BaseClient::handleSubmitResponse(&this->super_BaseClient,id,(char *)error_00);
      if (!bVar3) {
        if ((this->super_BaseClient).m_quiet != false) {
          return false;
        }
        if ((long)(this->super_BaseClient).m_retries <= (this->super_BaseClient).m_failures) {
          return false;
        }
        pcVar2 = (this->super_BaseClient).m_pool.m_url.m_host.m_data;
        uVar1 = (this->super_BaseClient).m_pool.m_url.m_port;
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)error,"code");
        Log::print(ERR,"[%s:%d] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",pcVar2,
                   (ulong)uVar1,error_00,(ulong)(pGVar4->data_).s.length);
        return false;
      }
    }
    else if ((result->data_).f.flags == 3) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_30,(Ch *)result);
      if ((local_30 !=
           (ulong)(result->data_).s.length * 0x20 + ((ulong)(result->data_).s.str & 0xffffffffffff))
         && (bVar3 = parseJob(this,result,&local_34), bVar3)) {
        return true;
      }
      bVar3 = BaseClient::handleSubmitResponse(&this->super_BaseClient,id,(char *)0x0);
      if (!bVar3) {
        return false;
      }
      getBlockTemplate(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool xmrig::DaemonClient::parseResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == -1) {
        return false;
    }

    if (error.IsObject()) {
        const char *message = error["message"].GetString();

        if (!handleSubmitResponse(id, message) && !isQuiet()) {
            LOG_ERR("[%s:%d] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", m_pool.host().data(), m_pool.port(), message, error["code"].GetInt());
        }

        return false;
    }

    if (!result.IsObject()) {
        return false;
    }

    int code = -1;
    if (result.HasMember(kBlocktemplateBlob) && parseJob(result, &code)) {
        return true;
    }

    if (handleSubmitResponse(id)) {
        getBlockTemplate();
        return true;
    }


    return false;
}